

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_forcingstep.c
# Opt level: O2

void forcingStep_PrintMem(ARKodeMem ark_mem,FILE *outfile)

{
  ARKodeForcingStepMem pAVar1;
  int iVar2;
  int k;
  ulong uVar3;
  ARKodeForcingStepMem step_mem;
  ARKodeForcingStepMem local_28;
  
  local_28 = (ARKodeForcingStepMem)0x0;
  iVar2 = forcingStep_AccessStepMem(ark_mem,"forcingStep_PrintMem",&local_28);
  pAVar1 = local_28;
  if (iVar2 == 0) {
    for (uVar3 = 0; uVar3 != 2; uVar3 = uVar3 + 1) {
      fprintf((FILE *)outfile,"ForcingStep: partition %i: n_stepper_evolves = %li\n",
              uVar3 & 0xffffffff,pAVar1->n_stepper_evolves[uVar3]);
    }
  }
  return;
}

Assistant:

static void forcingStep_PrintMem(ARKodeMem ark_mem, FILE* outfile)
{
  ARKodeForcingStepMem step_mem = NULL;
  int retval = forcingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return; }

  /* output long integer quantities */
  for (int k = 0; k < NUM_PARTITIONS; k++)
  {
    fprintf(outfile, "ForcingStep: partition %i: n_stepper_evolves = %li\n", k,
            step_mem->n_stepper_evolves[k]);
  }
}